

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoli.c
# Opt level: O0

int ffi2fi2(short *input,long ntodo,double scale,double zero,short *output,int *status)

{
  int *in_RCX;
  void *in_RDX;
  long in_RSI;
  void *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double dvalue;
  long ii;
  undefined8 local_38;
  
  if ((((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      dVar1 = ((double)(int)*(short *)((long)in_RDI + local_38 * 2) - in_XMM1_Qa) / in_XMM0_Qa;
      if (-32768.49 <= dVar1) {
        if (dVar1 <= 32767.49) {
          if (dVar1 < 0.0) {
            *(short *)((long)in_RDX + local_38 * 2) = (short)(int)(dVar1 + -0.5);
          }
          else {
            *(short *)((long)in_RDX + local_38 * 2) = (short)(int)(dVar1 + 0.5);
          }
        }
        else {
          *in_RCX = -0xb;
          *(undefined2 *)((long)in_RDX + local_38 * 2) = 0x7fff;
        }
      }
      else {
        *in_RCX = -0xb;
        *(undefined2 *)((long)in_RDX + local_38 * 2) = 0x8000;
      }
    }
  }
  else {
    memcpy(in_RDX,in_RDI,in_RSI << 1);
  }
  return *in_RCX;
}

Assistant:

int ffi2fi2(short *input,       /* I - array of values to be converted  */
            long ntodo,         /* I - number of elements in the array  */
            double scale,       /* I - FITS TSCALn or BSCALE value      */
            double zero,        /* I - FITS TZEROn or BZERO  value      */
            short *output,      /* O - output array of converted values */
            int *status)        /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        memcpy(output, input, ntodo * sizeof(short) );
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (short) (dvalue + .5);
                else
                    output[ii] = (short) (dvalue - .5);
            }
        }
    }
    return(*status);
}